

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory.cpp
# Opt level: O1

void __thiscall QSharedMemory::setNativeKey(QSharedMemory *this,QNativeIpcKey *key)

{
  QNativeIpcKey *rhs;
  QSharedMemoryPrivate *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  QAnyStringView a;
  QString local_58;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QSharedMemoryPrivate *)(this->super_QObject).d_ptr.d;
  rhs = &this_00->nativeKey;
  bVar1 = ::comparesEqual(key,rhs);
  if ((!bVar1) || ((key->key).d.size != 0)) {
    bVar1 = isKeyTypeSupported((key->typeAndFlags).type);
    if (bVar1) {
      if ((this->super_QObject).d_ptr.d[1].children.d.size != 0) {
        detach(this);
      }
      QSharedMemoryPrivate::cleanHandle(this_00);
      if ((key->typeAndFlags).type == (this_00->nativeKey).typeAndFlags.type) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          QNativeIpcKey::operator=(rhs,key);
          return;
        }
        goto LAB_0021af29;
      }
      QSharedMemoryPrivate::visit<QSharedMemoryPrivate::destructBackend()::_lambda(auto:1)_1_>
                (this_00,(anon_class_1_0_00000001 *)&local_40);
      QNativeIpcKey::operator=(rhs,key);
      if ((this_00->nativeKey).typeAndFlags.type == PosixRealtime) {
        (this_00->backend).d.posix.hand = -1;
      }
      else {
        (this_00->backend).d.sysv.nativeKeyFile.d.size = 0;
        *(undefined8 *)((long)&(this_00->backend).d + 0x18) = 0;
        (this_00->backend).d.sysv.nativeKeyFile.d.d = (Data *)0x0;
        (this_00->backend).d.sysv.nativeKeyFile.d.ptr = (char *)0x0;
      }
    }
    else {
      QMetaObject::tr(&local_58,&staticMetaObject,"%1: unsupported key type",(char *)0x0,-1);
      a.m_size = 0x400000000000001b;
      a.field_0.m_data_utf8 = "QSharedMemory::setNativeKey";
      QString::arg_impl(&local_40,&local_58,a,0,(QChar)0x20);
      this_00->error = KeyError;
      QString::operator=(&this_00->errorString,&local_40);
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_0021af29:
  __stack_chk_fail();
}

Assistant:

void QSharedMemory::setNativeKey(const QNativeIpcKey &key)
{
    Q_D(QSharedMemory);
    if (key == d->nativeKey && key.isEmpty())
        return;
    if (!isKeyTypeSupported(key.type())) {
        d->setError(KeyError, tr("%1: unsupported key type")
                    .arg("QSharedMemory::setNativeKey"_L1));
        return;
    }

    if (isAttached())
        detach();
    d->cleanHandle();
    if (key.type() == d->nativeKey.type()) {
        // we can reuse the backend
        d->nativeKey = key;
    } else {
        // we must recreate the backend
        d->destructBackend();
        d->nativeKey = key;
        d->constructBackend();
    }
}